

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::FillHelper
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *threadContext;
  undefined4 *puVar4;
  Var pvVar5;
  uint64 *puVar6;
  double value;
  int64 local_d8;
  int64 i_1;
  BigIndex dstIndex_1;
  int64 i;
  BigIndex dstIndex;
  long lStack_a0;
  uint32 u32k;
  uint64 local_98;
  int64 end;
  int64 finalVal;
  int64 k;
  Var fillValue;
  JavascriptLibrary *pJStack_70;
  bool isTypedArrayEntryPoint;
  JavascriptLibrary *library;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  int64 length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_58,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,pArr);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x250b,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pJStack_70 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  fillValue._7_1_ = typedArrayBase != (TypedArrayBase *)0x0;
  obj_local = (RecyclableObject *)typedArrayBase;
  if (((!(bool)fillValue._7_1_) && (pArr == (JavascriptArray *)0x0)) &&
     (bVar2 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar2)) {
    obj_local = (RecyclableObject *)UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  if ((SUB84(args->Info,0) & 0xffffff) == 1 || ((ulong)args->Info & 0xffffff) == 0) {
    k = (int64)JavascriptLibraryBase::GetUndefined(&pJStack_70->super_JavascriptLibraryBase);
  }
  else {
    k = (int64)Arguments::operator[](args,1);
    if ((fillValue._7_1_ & 1) != 0) {
      JsReentLock::unlock((JsReentLock *)local_58);
      value = JavascriptConversion::ToNumber((Var)k,(ScriptContext *)jsReentLock._24_8_);
      k = (int64)JavascriptNumber::ToVarNoCheck(value,(ScriptContext *)jsReentLock._24_8_);
    }
  }
  finalVal = 0;
  end = length;
  typedArrayBase_local = (TypedArrayBase *)pArr;
  if (2 < (SUB84(args->Info,0) & 0xffffff)) {
    JsReentLock::unlock((JsReentLock *)local_58);
    pvVar5 = Arguments::operator[](args,2);
    finalVal = GetIndexFromVar(pvVar5,length,(ScriptContext *)jsReentLock._24_8_);
    if (3 < (SUB84(args->Info,0) & 0xffffff)) {
      pvVar5 = Arguments::operator[](args,3);
      BVar3 = Js::JavascriptOperators::IsUndefinedObject(pvVar5);
      if (BVar3 == 0) {
        JsReentLock::unlock((JsReentLock *)local_58);
        pvVar5 = Arguments::operator[](args,3);
        end = GetIndexFromVar(pvVar5,length,(ScriptContext *)jsReentLock._24_8_);
      }
    }
    if ((pArr != (JavascriptArray *)0x0) && (bVar2 = IsNonES5Array(obj), !bVar2)) {
      bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2535,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      typedArrayBase_local = (TypedArrayBase *)0x0;
    }
  }
  if (finalVal < 0xffffffff) {
    lStack_a0 = 0xffffffff;
    puVar6 = (uint64 *)min<long>(&end,&stack0xffffffffffffff60);
    local_98 = *puVar6;
    for (dstIndex.bigIndex._4_4_ = (uint)finalVal;
        (long)(ulong)dstIndex.bigIndex._4_4_ < (long)local_98;
        dstIndex.bigIndex._4_4_ = dstIndex.bigIndex._4_4_ + 1) {
      if (obj_local == (RecyclableObject *)0x0) {
        if (typedArrayBase_local == (TypedArrayBase *)0x0) {
          JsReentLock::unlock((JsReentLock *)local_58);
          Js::JavascriptOperators::OP_SetElementI_UInt32
                    (obj,dstIndex.bigIndex._4_4_,(Var)k,(ScriptContext *)jsReentLock._24_8_,
                     PropertyOperation_ThrowIfNotExtensible);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          JsReentLock::relock((JsReentLock *)local_58);
        }
        else {
          (*(typedArrayBase_local->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x29])
                    (typedArrayBase_local,(ulong)dstIndex.bigIndex._4_4_,k,4);
        }
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_58);
        (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(obj_local,(ulong)dstIndex.bigIndex._4_4_,k);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
      }
    }
    BigIndex::BigIndex((BigIndex *)&i,0xffffffff);
    for (dstIndex_1.bigIndex = local_98; (long)dstIndex_1.bigIndex < end;
        dstIndex_1.bigIndex = dstIndex_1.bigIndex + 1) {
      if (typedArrayBase_local == (TypedArrayBase *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_58);
        pvVar5 = JavascriptNumber::ToVar(dstIndex_1.bigIndex,(ScriptContext *)jsReentLock._24_8_);
        Js::JavascriptOperators::OP_SetElementI
                  (obj,pvVar5,(Var)k,(ScriptContext *)jsReentLock._24_8_,
                   PropertyOperation_ThrowIfNotExtensible);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
      }
      else {
        GenericDirectSetItemAt((JavascriptArray *)typedArrayBase_local,(BigIndex *)&i,(Var)k);
        BigIndex::operator++((BigIndex *)&i);
      }
    }
  }
  else {
    BigIndex::BigIndex((BigIndex *)&i_1,finalVal);
    for (local_d8 = finalVal; local_d8 < end; local_d8 = local_d8 + 1) {
      if (typedArrayBase_local == (TypedArrayBase *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_58);
        pvVar5 = JavascriptNumber::ToVar(local_d8,(ScriptContext *)jsReentLock._24_8_);
        Js::JavascriptOperators::OP_SetElementI
                  (obj,pvVar5,(Var)k,(ScriptContext *)jsReentLock._24_8_,
                   PropertyOperation_ThrowIfNotExtensible);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
      }
      else {
        GenericDirectSetItemAt((JavascriptArray *)typedArrayBase_local,(BigIndex *)&i_1,(Var)k);
        BigIndex::operator++((BigIndex *)&i_1);
      }
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_58);
  return obj;
}

Assistant:

Var JavascriptArray::FillHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        Assert(args.Info.Count > 0);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        // If we came from Array.prototype.fill and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var fillValue;

        if (args.Info.Count > 1)
        {
            fillValue = args[1];
            if (isTypedArrayEntryPoint)
            {
                JS_REENTRANT_UNLOCK(jsReentLock, fillValue = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(fillValue, scriptContext), scriptContext));
            }
        }
        else
        {
            fillValue = library->GetUndefined();
        }

        int64 k = 0;
        int64 finalVal = length;

        if (args.Info.Count > 2)
        {
            JS_REENTRANT_UNLOCK(jsReentLock, k = JavascriptArray::GetIndexFromVar(args[2], length, scriptContext));

            if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, finalVal = JavascriptArray::GetIndexFromVar(args[3], length, scriptContext));
            }

            // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
            // we will process the array elements like an ES5Array.
            if (pArr && !JavascriptArray::IsNonES5Array(obj))
            {
                AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                pArr = nullptr;
            }
        }

        if (k < MaxArrayLength)
        {
            int64 end = min<int64>(finalVal, MaxArrayLength);
            uint32 u32k = static_cast<uint32>(k);

            while (u32k < end)
            {
                if (typedArrayBase)
                {
                    JS_REENTRANT(jsReentLock, typedArrayBase->DirectSetItem(u32k, fillValue));
                }
                else if (pArr)
                {
                    pArr->SetItem(u32k, fillValue, PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI_UInt32(obj, u32k, fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }

                u32k++;
            }

            BigIndex dstIndex = MaxArrayLength;

            for (int64 i = end; i < finalVal; ++i)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }
        else
        {
            BigIndex dstIndex = static_cast<uint64>(k);

            for (int64 i = k; i < finalVal; i++)
            {
                if (pArr)
                {
                    pArr->GenericDirectSetItemAt(dstIndex, fillValue);
                    ++dstIndex;
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        JavascriptOperators::OP_SetElementI(obj, JavascriptNumber::ToVar(i, scriptContext), fillValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible));
                }
            }
        }

        return obj;
    }